

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O0

int damcalc(int num,int sides,aspect dam_aspect)

{
  aspect dam_aspect_local;
  int sides_local;
  int num_local;
  
  switch(dam_aspect) {
  case MINIMISE:
    sides_local = num;
    break;
  case AVERAGE:
    sides_local = (num * (sides + 1)) / 2;
    break;
  case MAXIMISE:
  case EXTREMIFY:
    sides_local = num * sides;
    break;
  case RANDOMISE:
    sides_local = damroll(num,sides);
    break;
  default:
    __assert_fail("0 && \"Should never reach here\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-rand.c"
                  ,0x17f,"int damcalc(int, int, aspect)");
  }
  return sides_local;
}

Assistant:

int damcalc(int num, int sides, aspect dam_aspect)
{
	switch (dam_aspect) {
		case MAXIMISE:
		case EXTREMIFY: return num * sides;
		case RANDOMISE: return damroll(num, sides);
		case MINIMISE: return num;
		case AVERAGE: return num * (sides + 1) / 2;
	}

	assert(0 && "Should never reach here");
	return 0;
}